

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

int __thiscall re2::Regexp::NumCaptures(Regexp *this)

{
  int iVar1;
  undefined1 local_78 [8];
  NumCapturesWalker w;
  Regexp *this_local;
  
  w._96_8_ = this;
  NumCapturesWalker::NumCapturesWalker((NumCapturesWalker *)local_78);
  Walker<int>::Walk((Walker<int> *)local_78,this,0);
  iVar1 = NumCapturesWalker::ncapture((NumCapturesWalker *)local_78);
  NumCapturesWalker::~NumCapturesWalker((NumCapturesWalker *)local_78);
  return iVar1;
}

Assistant:

int Regexp::NumCaptures() {
  NumCapturesWalker w;
  w.Walk(this, 0);
  return w.ncapture();
}